

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpparser.c
# Opt level: O1

parse_status_t parser_parse_responseline(http_parser_t *parser)

{
  char *pcVar1;
  size_t *psVar2;
  int *piVar3;
  int *piVar4;
  int *piVar5;
  char cVar6;
  char *pcVar7;
  parse_status_t pVar8;
  int iVar9;
  ushort **ppuVar10;
  char *pcVar11;
  ulong uVar12;
  memptr line;
  token_type_t tok_type;
  memptr local_40;
  token_type_t local_2c;
  
  if (parser->position != POS_RESPONSE_LINE) {
    __assert_fail("parser->position == POS_RESPONSE_LINE",".upnp/src/genlib/net/http/httpparser.c",
                  0x56d,"parse_status_t parser_parse_responseline(http_parser_t *)");
  }
  do {
    pVar8 = scanner_get_token(&parser->scanner,&local_40,&local_2c);
    if (pVar8 != PARSE_OK) {
      return pVar8;
    }
  } while (local_2c - TT_WHITESPACE < 2);
  psVar2 = &(parser->scanner).cursor;
  *psVar2 = *psVar2 - local_40.length;
  pVar8 = match(&parser->scanner,"%ihttp%w/%w%L%c",&local_40);
  if (pVar8 == PARSE_OK) {
    cVar6 = local_40.buf[local_40.length];
    local_40.buf[local_40.length] = '\0';
    piVar3 = &(parser->msg).major_version;
    piVar4 = &(parser->msg).minor_version;
    piVar5 = &(parser->msg).status_code;
    iVar9 = __isoc99_sscanf(local_40.buf,"%d . %d %d",piVar3,piVar4,piVar5);
    local_40.buf[local_40.length] = cVar6;
    pVar8 = PARSE_FAILURE;
    if ((((iVar9 == 3) && (-1 < *piVar3)) && (-1 < *piVar4)) && (-1 < *piVar5)) {
      ppuVar10 = __ctype_b_loc();
      uVar12 = ~(ulong)local_40.buf;
      iVar9 = 0;
      do {
        pcVar1 = local_40.buf + -1;
        pcVar7 = local_40.buf + uVar12;
        do {
          pcVar11 = pcVar7;
          local_40.buf = pcVar1;
          pcVar1 = local_40.buf + 1;
          pcVar7 = pcVar11 + 1;
        } while ((*(byte *)((long)*ppuVar10 + (long)local_40.buf[1] * 2 + 1) & 8) == 0);
        do {
          pcVar1 = local_40.buf + 1;
          local_40.buf = local_40.buf + 1;
          pcVar11 = pcVar11 + 1;
        } while ((*(byte *)((long)*ppuVar10 + (long)*pcVar1 * 2 + 1) & 8) != 0);
        iVar9 = iVar9 + 1;
      } while (iVar9 != 3);
      if ((*local_40.buf == ' ') || (*local_40.buf == '\t')) {
        for (; (*local_40.buf == ' ' || (*local_40.buf == '\t')); local_40.buf = local_40.buf + 1) {
          pcVar11 = pcVar11 + 1;
        }
        iVar9 = membuffer_assign(&(parser->msg).status_msg,local_40.buf,
                                 local_40.length - (long)pcVar11);
        if (iVar9 == 0) {
          parser->position = POS_HEADERS;
          pVar8 = PARSE_OK;
        }
        else {
          parser->http_error_code = 500;
        }
      }
    }
  }
  return pVar8;
}

Assistant:

parse_status_t parser_parse_responseline(http_parser_t *parser)
{
	parse_status_t status;
	http_message_t *hmsg = &parser->msg;
	memptr line;
	char save_char;
	int num_scanned;
	int i;
	size_t n;
	char *p;

	assert(parser->position == POS_RESPONSE_LINE);

	status = skip_blank_lines(&parser->scanner);
	if (status != (parse_status_t)PARSE_OK)
		return status;
	/* response line */
	/*status = match( &parser->scanner, "%ihttp%w/%w%d\t.\t%d\t%d\t%L%c", */
	/*  &hmsg->major_version, &hmsg->minor_version, */
	/*  &hmsg->status_code, &hmsg->status_msg ); */
	status = match(&parser->scanner, "%ihttp%w/%w%L%c", &line);
	if (status != (parse_status_t)PARSE_OK)
		return status;
	save_char = line.buf[line.length];
	line.buf[line.length] = '\0'; /* null-terminate */
				      /* scan http version and ret code */
#ifdef _WIN32
	num_scanned = sscanf_s(line.buf,
#else
	num_scanned = sscanf(line.buf,
#endif
		"%d . %d %d",
		&hmsg->major_version,
		&hmsg->minor_version,
		&hmsg->status_code);
	line.buf[line.length] = save_char; /* restore */
	if (num_scanned != 3 || hmsg->major_version < 0 ||
		hmsg->minor_version < 0 || hmsg->status_code < 0)
		/* bad response line */
		return PARSE_FAILURE;
	/* point to status msg */
	p = line.buf;
	/* skip 3 ints */
	for (i = 0; i < 3; i++) {
		/* go to start of num */
		while (!isdigit(*p))
			p++;
		/* skip int */
		while (isdigit(*p))
			p++;
	}
	/* whitespace must exist after status code */
	if (*p != ' ' && *p != '\t')
		return PARSE_FAILURE;
	/* skip whitespace */
	while (*p == ' ' || *p == '\t')
		p++;
	/* now, p is at start of status msg */
	n = line.length - ((size_t)p - (size_t)line.buf);
	if (membuffer_assign(&hmsg->status_msg, p, n) != 0) {
		/* out of mem */
		parser->http_error_code = HTTP_INTERNAL_SERVER_ERROR;
		return PARSE_FAILURE;
	}
	parser->position = POS_HEADERS; /* move to headers */

	return PARSE_OK;
}